

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall CoreML::ShapeConstraint::ShapeConstraint(ShapeConstraint *this,string *name)

{
  pointer pcVar1;
  
  ShapeRange::ShapeRange(&this->_sequenceRange);
  ShapeRange::ShapeRange(&this->_batchRange);
  ShapeRange::ShapeRange(&this->_channelRange);
  ShapeRange::ShapeRange(&this->_heightRange);
  ShapeRange::ShapeRange(&this->_widthRange);
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

ShapeConstraint::ShapeConstraint(const std::string& name)
:
_name(name) {}